

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O0

char * strtok_r(char *__s,char *__delim,char **__save_ptr)

{
  size_t sVar1;
  char *pcVar2;
  char *ret;
  char **nextp_local;
  char *delim_local;
  char *str_local;
  
  delim_local = __s;
  if (__s == (char *)0x0) {
    delim_local = *__save_ptr;
  }
  sVar1 = strspn(delim_local,__delim);
  str_local = delim_local + sVar1;
  if (*str_local == '\0') {
    str_local = (char *)0x0;
  }
  else {
    sVar1 = strcspn(str_local,__delim);
    pcVar2 = str_local + sVar1;
    delim_local = pcVar2;
    if (*pcVar2 != '\0') {
      delim_local = pcVar2 + 1;
      *pcVar2 = '\0';
    }
    *__save_ptr = delim_local;
  }
  return str_local;
}

Assistant:

char* strtok_r(char* str, const char* delim, char** nextp)
{
  char* ret;

  if (str == NULL)
    str = *nextp;

  str += strspn(str, delim);

  if (*str == '\0')
    return NULL;

  ret = str;
  str += strcspn(str, delim);

  if (*str)
    *str++ = '\0';

  *nextp = str;

  return ret;
}